

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

int lj_cf_load(lua_State *L)

{
  int iVar1;
  GCstr *pGVar2;
  GCstr *pGVar3;
  TValue *pTVar4;
  GCstr *pGVar5;
  TValue *pTVar6;
  GCstr *chunkname;
  GCstr **data;
  code *reader;
  GCstr *local_30;
  ulong local_28;
  
  pTVar4 = L->base;
  pTVar6 = L->top;
  if ((pTVar4 + 1 < pTVar6) && (*(int *)((long)pTVar4 + 0xc) != -1)) {
    pGVar2 = lj_lib_checkstr(L,2);
    pTVar4 = L->base;
    pTVar6 = L->top;
  }
  else {
    pGVar2 = (GCstr *)0x0;
  }
  if ((pTVar4 + 2 < pTVar6) && (*(int *)((long)pTVar4 + 0x14) != -1)) {
    pGVar3 = lj_lib_checkstr(L,3);
    pTVar4 = L->base;
    pTVar6 = L->top;
  }
  else {
    pGVar3 = (GCstr *)0x0;
  }
  if (pTVar4 < pTVar6) {
    if ((pTVar4->field_2).it == 0xfffffffb || (pTVar4->field_2).it < 0xffff0000) {
      pGVar5 = lj_lib_checkstr(L,1);
      lua_settop(L,4);
      local_30 = pGVar5 + 1;
      if (pGVar2 == (GCstr *)0x0) {
        pGVar2 = pGVar5;
      }
      chunkname = pGVar2 + 1;
      pGVar2 = pGVar3 + 1;
      if (pGVar3 == (GCstr *)0x0) {
        pGVar2 = pGVar3;
      }
      local_28 = (ulong)pGVar5->len;
      data = &local_30;
      reader = reader_string;
    }
    else {
      if ((pTVar4->field_2).it != 0xfffffff7) goto LAB_00143736;
      lua_settop(L,5);
      chunkname = (GCstr *)"=(load)";
      if (pGVar2 != (GCstr *)0x0) {
        chunkname = pGVar2 + 1;
      }
      pGVar2 = pGVar3 + 1;
      if (pGVar3 == (GCstr *)0x0) {
        pGVar2 = pGVar3;
      }
      reader = reader_func;
      data = (GCstr **)0x0;
    }
    iVar1 = lua_loadx(L,reader,data,(char *)chunkname,(char *)pGVar2);
    iVar1 = load_aux(L,iVar1,4);
    return iVar1;
  }
LAB_00143736:
  lj_err_argt(L,1,6);
}

Assistant:

LJLIB_CF(load)
{
  GCstr *name = lj_lib_optstr(L, 2);
  GCstr *mode = lj_lib_optstr(L, 3);
  int status;
  if (L->base < L->top && (tvisstr(L->base) || tvisnumber(L->base))) {
    GCstr *s = lj_lib_checkstr(L, 1);
    lua_settop(L, 4);  /* Ensure env arg exists. */
    status = luaL_loadbufferx(L, strdata(s), s->len, strdata(name ? name : s),
			      mode ? strdata(mode) : NULL);
  } else {
    lj_lib_checkfunc(L, 1);
    lua_settop(L, 5);  /* Reserve a slot for the string from the reader. */
    status = lua_loadx(L, reader_func, NULL, name ? strdata(name) : "=(load)",
		       mode ? strdata(mode) : NULL);
  }
  return load_aux(L, status, 4);
}